

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O0

Gia_Man_t * Eso_ManCoverConvert(Eso_Man_t *p,Vec_Ptr_t *vCover)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar5;
  bool bVar6;
  Vec_Int_t *vCube;
  int iAnd;
  int Lit;
  int k;
  int iRoot;
  int Cube;
  int c;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vEsop;
  Vec_Ptr_t *vCover_local;
  Eso_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p->pGia);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pGia->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pGia->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManHashAlloc(p_00);
  pGVar4 = Gia_ManConst0(p->pGia);
  pGVar4->Value = 0;
  Cube = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->pGia->vCis);
    bVar6 = false;
    if (Cube < iVar1) {
      _c = Gia_ManCi(p->pGia,Cube);
      bVar6 = _c != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _c->Value = uVar2;
    Cube = Cube + 1;
  }
  for (Cube = 0; iVar1 = Vec_PtrSize(vCover), Cube < iVar1; Cube = Cube + 1) {
    p_01 = (Vec_Int_t *)Vec_PtrEntry(vCover,Cube);
    iVar1 = Vec_IntSize(p_01);
    if (iVar1 < 1) {
      Gia_ManAppendCo(p_00,0);
    }
    else {
      Lit = 0;
      for (iRoot = 0; iVar1 = Vec_IntSize(p_01), iRoot < iVar1; iRoot = iRoot + 1) {
        iVar1 = Vec_IntEntry(p_01,iRoot);
        vCube._4_4_ = 1;
        if (iVar1 != p->Cube1) {
          p_02 = Eso_ManCube(p,iVar1);
          for (iAnd = 0; iVar1 = Vec_IntSize(p_02), iAnd < iVar1; iAnd = iAnd + 1) {
            iVar1 = Vec_IntEntry(p_02,iAnd);
            vCube._4_4_ = Gia_ManHashAnd(p_00,vCube._4_4_,iVar1 + 2);
          }
        }
        Lit = Gia_ManHashXor(p_00,Lit,vCube._4_4_);
      }
      Gia_ManAppendCo(p_00,Lit);
    }
  }
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Eso_ManCoverConvert( Eso_Man_t * p, Vec_Ptr_t * vCover )
{
    Vec_Int_t * vEsop;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;  int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p->pGia)->Value = 0;
    Gia_ManForEachCi( p->pGia, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Vec_PtrForEachEntry( Vec_Int_t *, vCover, vEsop, i )
    {
        if ( Vec_IntSize(vEsop) > 0 )
        {
            int c, Cube, iRoot = 0;
            Vec_IntForEachEntry( vEsop, Cube, c )
            {
                int k, Lit, iAnd = 1;
                if ( Cube != p->Cube1 )
                {
                    Vec_Int_t * vCube = Eso_ManCube( p, Cube );
                    Vec_IntForEachEntry( vCube, Lit, k )
                        iAnd = Gia_ManHashAnd( pNew, iAnd, Lit + 2 );
                }
                iRoot = Gia_ManHashXor( pNew, iRoot, iAnd );
            }
            Gia_ManAppendCo( pNew, iRoot );
        }
        else
            Gia_ManAppendCo( pNew, 0 );
    }
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}